

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

ArrayPtr<const_capnp::word>
capnp::initMessageBuilderFromFlatArrayCopy
          (ArrayPtr<const_capnp::word> array,MessageBuilder *target,ReaderOptions options)

{
  word *pwVar1;
  word *end;
  ArrayPtr<const_capnp::word> AVar2;
  ReaderOptions options_00;
  Reader local_188;
  uint64_t local_168;
  int iStack_160;
  word *local_158;
  size_t sStack_150;
  undefined1 local_140 [8];
  FlatArrayMessageReader reader;
  MessageBuilder *target_local;
  ReaderOptions options_local;
  ArrayPtr<const_capnp::word> array_local;
  
  sStack_150 = array.size_;
  local_158 = array.ptr;
  local_168 = options.traversalLimitInWords;
  iStack_160 = options.nestingLimit;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  reader.end = (word *)target;
  options_local.traversalLimitInWords._0_4_ = iStack_160;
  options_local._8_8_ = local_158;
  FlatArrayMessageReader::FlatArrayMessageReader
            ((FlatArrayMessageReader *)local_140,array,options_00);
  pwVar1 = reader.end;
  MessageReader::getRoot<capnp::AnyPointer>(&local_188,(MessageReader *)local_140);
  MessageBuilder::setRoot<capnp::AnyPointer::Reader>((MessageBuilder *)pwVar1,&local_188);
  pwVar1 = FlatArrayMessageReader::getEnd((FlatArrayMessageReader *)local_140);
  end = kj::ArrayPtr<const_capnp::word>::end
                  ((ArrayPtr<const_capnp::word> *)&options_local.nestingLimit);
  AVar2 = kj::arrayPtr<capnp::word_const>(pwVar1,end);
  FlatArrayMessageReader::~FlatArrayMessageReader((FlatArrayMessageReader *)local_140);
  return AVar2;
}

Assistant:

kj::ArrayPtr<const word> initMessageBuilderFromFlatArrayCopy(
    kj::ArrayPtr<const word> array, MessageBuilder& target, ReaderOptions options) {
  FlatArrayMessageReader reader(array, options);
  target.setRoot(reader.getRoot<AnyPointer>());
  return kj::arrayPtr(reader.getEnd(), array.end());
}